

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beagle_BeagleJNIWrapper.cpp
# Opt level: O0

jint Java_beagle_BeagleJNIWrapper_calculateEdgeDerivative
               (JNIEnv *env,jobject obj,jint instance,jintArray postBufferIndices,
               jintArray preBufferIndices,jint rootBufferIndex,jintArray firstDerivativeIndices,
               jintArray secondDerivativeIndices,jint categoryWeightsIndex,jint categoryRatesIndex,
               jint stateFrequenciesIndex,jintArray cumulativeScaleIndices,jint count,
               jdoubleArray outFirstDerivative,jdoubleArray outDiagonalSecondDerivative)

{
  jint jVar1;
  jint *pjVar2;
  jint *pjVar3;
  jint *pjVar4;
  JNIEnv_ *this;
  undefined4 in_EDX;
  undefined4 in_R9D;
  long in_stack_00000010;
  undefined4 in_stack_00000018;
  undefined4 in_stack_00000020;
  undefined4 in_stack_00000028;
  long in_stack_00000048;
  jint errCode;
  jint *cumulativeScalingIndices;
  jint *hessianMatrixIndices;
  jint *gradientMatrixIndices;
  jint *preOrderBufferIndices;
  jint *postOrderBufferIndices;
  jdouble *outDiagonalHessian;
  jdouble *outGradient;
  undefined4 in_stack_ffffffffffffff28;
  jint in_stack_ffffffffffffff2c;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  undefined4 in_stack_ffffffffffffff3c;
  jint *local_a0;
  
  JNIEnv_::GetDoubleArrayElements
            ((JNIEnv_ *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
             (jdoubleArray)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
             (jboolean *)0x104d09);
  if (in_stack_00000048 != 0) {
    JNIEnv_::GetDoubleArrayElements
              ((JNIEnv_ *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
               (jdoubleArray)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
               (jboolean *)0x104d35);
  }
  pjVar2 = JNIEnv_::GetIntArrayElements
                     ((JNIEnv_ *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                      (jintArray)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                      (jboolean *)0x104d68);
  pjVar3 = JNIEnv_::GetIntArrayElements
                     ((JNIEnv_ *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                      (jintArray)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                      (jboolean *)0x104d86);
  pjVar4 = JNIEnv_::GetIntArrayElements
                     ((JNIEnv_ *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                      (jintArray)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                      (jboolean *)0x104da4);
  if (in_stack_00000010 == 0) {
    local_a0 = (jint *)0x0;
  }
  else {
    local_a0 = JNIEnv_::GetIntArrayElements
                         ((JNIEnv_ *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                          (jintArray)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                          (jboolean *)0x104dcd);
  }
  this = (JNIEnv_ *)
         JNIEnv_::GetIntArrayElements
                   ((JNIEnv_ *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                    (jintArray)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                    (jboolean *)0x104e00);
  jVar1 = beagleCalculateEdgeDerivative
                    (in_EDX,pjVar2,pjVar3,in_R9D,pjVar4,local_a0,in_stack_00000018);
  JNIEnv_::ReleaseDoubleArrayElements
            (this,(jdoubleArray)CONCAT44(in_stack_ffffffffffffff3c,in_stack_00000028),
             (jdouble *)CONCAT44(in_stack_ffffffffffffff34,in_stack_00000020),
             in_stack_ffffffffffffff2c);
  if (in_stack_00000048 != 0) {
    JNIEnv_::ReleaseDoubleArrayElements
              (this,(jdoubleArray)CONCAT44(in_stack_ffffffffffffff3c,in_stack_00000028),
               (jdouble *)CONCAT44(in_stack_ffffffffffffff34,in_stack_00000020),
               in_stack_ffffffffffffff2c);
  }
  return jVar1;
}

Assistant:

JNIEXPORT jint JNICALL Java_beagle_BeagleJNIWrapper_calculateEdgeDerivative
(JNIEnv *env, jobject obj, jint instance, jintArray postBufferIndices, jintArray preBufferIndices,
 jint rootBufferIndex, jintArray firstDerivativeIndices, jintArray secondDerivativeIndices,
 jint categoryWeightsIndex, jint categoryRatesIndex, jint stateFrequenciesIndex,
 jintArray cumulativeScaleIndices, jint count,
 jdoubleArray outFirstDerivative, jdoubleArray outDiagonalSecondDerivative)
{
    jdouble *outGradient = env->GetDoubleArrayElements(outFirstDerivative, NULL);
    jdouble *outDiagonalHessian = outDiagonalSecondDerivative != NULL ? env->GetDoubleArrayElements(outDiagonalSecondDerivative, NULL) : NULL;
    jint *postOrderBufferIndices = env->GetIntArrayElements(postBufferIndices, NULL);
    jint *preOrderBufferIndices  = env->GetIntArrayElements(preBufferIndices, NULL);
    jint *gradientMatrixIndices = env->GetIntArrayElements(firstDerivativeIndices, NULL);
    jint *hessianMatrixIndices  = secondDerivativeIndices != NULL ? env->GetIntArrayElements(secondDerivativeIndices, NULL) : NULL;
    jint *cumulativeScalingIndices = env->GetIntArrayElements(cumulativeScaleIndices, NULL);


    jint errCode = beagleCalculateEdgeDerivative(instance, (int*)postOrderBufferIndices, (int*)preOrderBufferIndices,
                                                 rootBufferIndex, (int*)gradientMatrixIndices, (int*)hessianMatrixIndices,
                                                 categoryWeightsIndex, categoryRatesIndex, stateFrequenciesIndex,
                                                 (int*)cumulativeScalingIndices, count, outGradient, outDiagonalHessian);
    env->ReleaseDoubleArrayElements(outFirstDerivative, outGradient, 0);
    if (outDiagonalSecondDerivative != NULL) {
        env->ReleaseDoubleArrayElements(outDiagonalSecondDerivative, outDiagonalHessian, 0);
    }
    return errCode;
}